

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_string_compare(JSContext *ctx,JSString *p1,JSString *p2)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = *(uint *)&(ctx->header).field_0x4 & 0x7fffffff;
  uVar2 = *(uint *)&p1->field_0x4 & 0x7fffffff;
  uVar1 = uVar2;
  if (uVar3 < uVar2) {
    uVar1 = uVar3;
  }
  uVar1 = js_string_memcmp((JSString *)ctx,p1,uVar1);
  if ((uVar1 == 0) && (uVar1 = 0, uVar3 != uVar2)) {
    uVar1 = -(uint)(uVar3 < uVar2) | 1;
  }
  return uVar1;
}

Assistant:

static int js_string_compare(JSContext *ctx,
                             const JSString *p1, const JSString *p2)
{
    int res, len;
    len = min_int(p1->len, p2->len);
    res = js_string_memcmp(p1, p2, len);
    if (res == 0) {
        if (p1->len == p2->len)
            res = 0;
        else if (p1->len < p2->len)
            res = -1;
        else
            res = 1;
    }
    return res;
}